

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraRtInterface.cpp
# Opt level: O2

void ChakraRTInterface::UnloadChakraDll(HINSTANCE library)

{
  code *pcVar1;
  FARPROC UNRECOVERED_JUMPTABLE;
  PAL_FILE *pPVar2;
  
  if (library == (HINSTANCE)0x0) {
    pPVar2 = PAL_get_stderr(0);
    PAL_fprintf(pPVar2,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ChakraRtInterface.cpp"
                ,0xdb,"library != nullptr","library != nullptr");
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  UNRECOVERED_JUMPTABLE = GetProcAddress(library,"DllCanUnloadNow");
  if (UNRECOVERED_JUMPTABLE != (FARPROC)0x0) {
    (*UNRECOVERED_JUMPTABLE)();
  }
  UNRECOVERED_JUMPTABLE = GetProcAddress(library,"DllMain");
  if (UNRECOVERED_JUMPTABLE != (FARPROC)0x0) {
    (*UNRECOVERED_JUMPTABLE)(library,0,0);
    return;
  }
  return;
}

Assistant:

void ChakraRTInterface::UnloadChakraDll(HINSTANCE library)
{
#ifndef CHAKRA_STATIC_LIBRARY
    Assert(library != nullptr);
    FARPROC pDllCanUnloadNow = (FARPROC) GetChakraCoreSymbol(library, "DllCanUnloadNow");
    if (pDllCanUnloadNow != nullptr)
    {
        pDllCanUnloadNow();
    }
#ifdef _WIN32
    UnloadChakraCore(library);
#else  // !_WIN32
    // PAL thread shutdown needs more time after execution completion.
    // Do not FreeLibrary. Invoke DllMain(DLL_PROCESS_DETACH) directly.
    typedef BOOL (__stdcall *PDLLMAIN)(HINSTANCE, DWORD, LPVOID);
    PDLLMAIN pDllMain = (PDLLMAIN) GetChakraCoreSymbol(library, "DllMain");
    if (pDllMain)
    {
        pDllMain(library, DLL_PROCESS_DETACH, NULL);
    }
#endif
#endif
}